

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O0

TestCase *
deqp::gles31::Functional::anon_unknown_0::createDiffTest
          (Context *context,PrePost prepost,char *name,BlendState *commonState,
          BlendState *drawBufferState)

{
  anon_union_8_2_d0736028_for_Maybe<tcu::Vector<bool,_4>_>_2 aVar1;
  bool bVar2;
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  *value;
  allocator<char> local_609;
  string local_608;
  allocator<char> local_5e1;
  string local_5e0;
  TextureFormat local_5c0;
  Vector<int,_2> local_5b8;
  DrawBufferInfo local_5b0;
  TextureFormat local_530;
  Vector<int,_2> local_528;
  DrawBufferInfo local_520;
  undefined1 local_4a0 [8];
  vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  drawBuffers_1;
  BlendFunc local_478;
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  local_470;
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  local_450;
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  local_428;
  bool local_401;
  Maybe<bool> local_400;
  undefined1 local_3f0 [8];
  BlendState preState_1;
  string local_380;
  allocator<char> local_359;
  string local_358;
  TextureFormat local_338;
  Vector<int,_2> local_330;
  DrawBufferInfo local_328;
  TextureFormat local_2a8;
  Vector<int,_2> local_2a0;
  DrawBufferInfo local_298;
  undefined1 local_218 [8];
  vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  drawBuffers;
  bool local_1e9;
  BlendFunc local_1e8;
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  local_1e0;
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  local_1c0;
  bool local_191;
  Maybe<bool> local_190;
  undefined1 local_180 [8];
  BlendState preState;
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  local_108;
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  local_d0;
  Maybe<bool> local_b0;
  undefined1 local_a0 [8];
  BlendState emptyState;
  BlendState *drawBufferState_local;
  BlendState *commonState_local;
  char *name_local;
  PrePost prepost_local;
  Context *context_local;
  
  emptyState.colorMask.field_1 =
       (anon_union_8_2_d0736028_for_Maybe<tcu::Vector<bool,_4>_>_2)drawBufferState;
  tcu::nothing<bool>();
  tcu::
  nothing<tcu::Either<unsigned_int,deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>>
            ();
  tcu::
  nothing<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>>
            ();
  tcu::nothing<tcu::Vector<bool,4>>();
  BlendState::BlendState
            ((BlendState *)local_a0,&local_b0,&local_d0,&local_108,
             (Maybe<tcu::Vector<bool,_4>_> *)&preState.colorMask.field_1);
  tcu::Maybe<tcu::Vector<bool,_4>_>::~Maybe
            ((Maybe<tcu::Vector<bool,_4>_> *)&preState.colorMask.field_1);
  tcu::
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  ::~Maybe(&local_108);
  tcu::
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  ::~Maybe(&local_d0);
  tcu::Maybe<bool>::~Maybe(&local_b0);
  if (prepost == PRE) {
    bVar2 = tcu::Maybe::operator_cast_to_bool((Maybe *)commonState);
    if (bVar2) {
      tcu::Maybe<bool>::Maybe(&local_190,&commonState->enableBlend);
    }
    else {
      local_191 = true;
      tcu::just<bool>((tcu *)&local_190,&local_191);
    }
    local_1e9 = tcu::Maybe::operator_cast_to_bool((Maybe *)&commonState->blendFunc);
    if (local_1e9) {
      tcu::
      Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
      ::Maybe(&local_1c0,&commonState->blendFunc);
    }
    else {
      BlendFunc::BlendFunc(&local_1e8,1,1);
      tcu::
      Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
      ::Either(&local_1e0,&local_1e8);
      tcu::
      just<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>>
                (&local_1c0,(tcu *)&local_1e0,value);
    }
    local_1e9 = !local_1e9;
    tcu::nothing<tcu::Vector<bool,4>>();
    BlendState::BlendState
              ((BlendState *)local_180,&local_190,&commonState->blendEq,&local_1c0,
               (Maybe<tcu::Vector<bool,_4>_> *)
               &drawBuffers.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    tcu::Maybe<tcu::Vector<bool,_4>_>::~Maybe
              ((Maybe<tcu::Vector<bool,_4>_> *)
               &drawBuffers.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    tcu::
    Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
    ::~Maybe(&local_1c0);
    if (local_1e9) {
      tcu::
      Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
      ::~Either(&local_1e0);
    }
    tcu::Maybe<bool>::~Maybe(&local_190);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ::vector((vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
              *)local_218);
    tcu::Vector<int,_2>::Vector(&local_2a0,0x40,0x40);
    tcu::TextureFormat::TextureFormat(&local_2a8,RGBA,UNORM_INT8);
    DrawBufferInfo::DrawBufferInfo(&local_298,true,&local_2a0,(BlendState *)local_a0,&local_2a8);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                 *)local_218,&local_298);
    DrawBufferInfo::~DrawBufferInfo(&local_298);
    tcu::Vector<int,_2>::Vector(&local_330,0x40,0x40);
    aVar1 = emptyState.colorMask.field_1;
    tcu::TextureFormat::TextureFormat(&local_338,RGBA,UNORM_INT8);
    DrawBufferInfo::DrawBufferInfo(&local_328,true,&local_330,(BlendState *)aVar1,&local_338);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                 *)local_218,&local_328);
    DrawBufferInfo::~DrawBufferInfo(&local_328);
    context_local = (Context *)operator_new(0x160);
    preState_1.colorMask.field_1.m_align._6_1_ = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_358,name,&local_359);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_380,name,
               (allocator<char> *)(preState_1.colorMask.field_1.m_data + 7));
    DrawBuffersIndexedTest::DrawBuffersIndexedTest
              ((DrawBuffersIndexedTest *)context_local,context,(BlendState *)local_180,
               (BlendState *)local_a0,
               (vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                *)local_218,&local_358,&local_380);
    preState_1.colorMask.field_1.m_align._6_1_ = 0;
    std::__cxx11::string::~string((string *)&local_380);
    std::allocator<char>::~allocator((allocator<char> *)(preState_1.colorMask.field_1.m_data + 7));
    std::__cxx11::string::~string((string *)&local_358);
    std::allocator<char>::~allocator(&local_359);
    preState_1.colorMask.field_1._0_1_ = '\x01';
    preState_1.colorMask.field_1._1_1_ = '\0';
    preState_1.colorMask.field_1._2_1_ = '\0';
    preState_1.colorMask.field_1._3_1_ = '\0';
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
               *)local_218);
    BlendState::~BlendState((BlendState *)local_180);
  }
  else if (prepost == POST) {
    local_401 = true;
    tcu::just<bool>((tcu *)&local_400,&local_401);
    tcu::
    nothing<tcu::Either<unsigned_int,deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>>
              ();
    BlendFunc::BlendFunc(&local_478,1,1);
    tcu::
    Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
    ::Either(&local_470,&local_478);
    tcu::
    Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
    ::Maybe(&local_450,&local_470);
    tcu::nothing<tcu::Vector<bool,4>>();
    BlendState::BlendState
              ((BlendState *)local_3f0,&local_400,&local_428,&local_450,
               (Maybe<tcu::Vector<bool,_4>_> *)
               &drawBuffers_1.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    tcu::Maybe<tcu::Vector<bool,_4>_>::~Maybe
              ((Maybe<tcu::Vector<bool,_4>_> *)
               &drawBuffers_1.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    tcu::
    Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
    ::~Maybe(&local_450);
    tcu::
    Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
    ::~Either(&local_470);
    tcu::
    Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
    ::~Maybe(&local_428);
    tcu::Maybe<bool>::~Maybe(&local_400);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ::vector((vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
              *)local_4a0);
    tcu::Vector<int,_2>::Vector(&local_528,0x40,0x40);
    tcu::TextureFormat::TextureFormat(&local_530,RGBA,UNORM_INT8);
    DrawBufferInfo::DrawBufferInfo(&local_520,true,&local_528,(BlendState *)local_a0,&local_530);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                 *)local_4a0,&local_520);
    DrawBufferInfo::~DrawBufferInfo(&local_520);
    tcu::Vector<int,_2>::Vector(&local_5b8,0x40,0x40);
    aVar1 = emptyState.colorMask.field_1;
    tcu::TextureFormat::TextureFormat(&local_5c0,RGBA,UNORM_INT8);
    DrawBufferInfo::DrawBufferInfo(&local_5b0,true,&local_5b8,(BlendState *)aVar1,&local_5c0);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                 *)local_4a0,&local_5b0);
    DrawBufferInfo::~DrawBufferInfo(&local_5b0);
    context_local = (Context *)operator_new(0x160);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5e0,name,&local_5e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_608,name,&local_609);
    DrawBuffersIndexedTest::DrawBuffersIndexedTest
              ((DrawBuffersIndexedTest *)context_local,context,(BlendState *)local_3f0,commonState,
               (vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                *)local_4a0,&local_5e0,&local_608);
    std::__cxx11::string::~string((string *)&local_608);
    std::allocator<char>::~allocator(&local_609);
    std::__cxx11::string::~string((string *)&local_5e0);
    std::allocator<char>::~allocator(&local_5e1);
    preState_1.colorMask.field_1._0_1_ = '\x01';
    preState_1.colorMask.field_1._1_1_ = '\0';
    preState_1.colorMask.field_1._2_1_ = '\0';
    preState_1.colorMask.field_1._3_1_ = '\0';
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
               *)local_4a0);
    BlendState::~BlendState((BlendState *)local_3f0);
  }
  else {
    context_local = (Context *)0x0;
    preState_1.colorMask.field_1._0_1_ = '\x01';
    preState_1.colorMask.field_1._1_1_ = '\0';
    preState_1.colorMask.field_1._2_1_ = '\0';
    preState_1.colorMask.field_1._3_1_ = '\0';
  }
  BlendState::~BlendState((BlendState *)local_a0);
  return (TestCase *)context_local;
}

Assistant:

TestCase* createDiffTest (Context& context, PrePost prepost, const char* name, const BlendState& commonState, const BlendState& drawBufferState)
{
	const BlendState emptyState = BlendState(tcu::nothing<bool>(), tcu::nothing<Either<BlendEq, SeparateBlendEq> >(), tcu::nothing<Either<BlendFunc, SeparateBlendFunc> >(), tcu::nothing<BVec4>());

	if (prepost == PRE)
	{
		const BlendState		preState	= BlendState((commonState.enableBlend ? commonState.enableBlend : just(true)),
														 commonState.blendEq,
														 (commonState.blendFunc ? commonState.blendFunc : just(Either<BlendFunc, SeparateBlendFunc>(BlendFunc(GL_ONE, GL_ONE)))),
														 tcu::nothing<BVec4>());
		vector<DrawBufferInfo>	drawBuffers;

		drawBuffers.push_back(DrawBufferInfo(true, IVec2(64, 64), emptyState, TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8)));
		drawBuffers.push_back(DrawBufferInfo(true, IVec2(64, 64), drawBufferState, TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8)));

		return new DrawBuffersIndexedTest(context, preState, emptyState, drawBuffers, name, name);
	}
	else if (prepost == POST)
	{
		const BlendState		preState	= BlendState(just(true),
														 tcu::nothing<Either<BlendEq, SeparateBlendEq> >(),
														 Maybe<Either<BlendFunc, SeparateBlendFunc> >(BlendFunc(GL_ONE, GL_ONE)),
														 tcu::nothing<BVec4>());
		vector<DrawBufferInfo>	drawBuffers;

		drawBuffers.push_back(DrawBufferInfo(true, IVec2(64, 64), emptyState, TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8)));
		drawBuffers.push_back(DrawBufferInfo(true, IVec2(64, 64), drawBufferState, TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8)));

		return new DrawBuffersIndexedTest(context, preState, commonState, drawBuffers, name, name);
	}
	else
	{
		DE_ASSERT(false);
		return DE_NULL;
	}
}